

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.h
# Opt level: O2

void __thiscall String::~String(String *this)

{
  ~String(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

String(const std::string& value): Value(TypeName::String), value_(value) {}